

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

void __thiscall
TempTracker<NumberTemp>::ProcessUse
          (TempTracker<NumberTemp> *this,StackSym *sym,BackwardPass *backwardPass)

{
  BVIndex i;
  uint dstSymID;
  Instr *instr;
  Opnd *pOVar1;
  PropertySym *propertySym;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  OpndKind OVar6;
  undefined4 *puVar7;
  BVSparse<Memory::JitArenaAllocator> **ppBVar8;
  char16_t *pcVar9;
  BackwardPass *backwardPass_00;
  char16_t *pcVar10;
  Instr *sym_00;
  
  if (sym->m_type == TyVar) {
    instr = backwardPass->currentInstr;
    i = (sym->super_Sym).m_id;
    sym_00 = instr;
    bVar3 = NumberTemp::IsTempPropertyTransferStore(&this->super_NumberTemp,instr,backwardPass);
    bVar4 = true;
    if (!bVar3) {
      bVar4 = NumberTemp::IsTempUse(instr,(Sym *)sym_00,backwardPass_00);
    }
    if (bVar4 == false) {
      BVSparse<Memory::JitArenaAllocator>::Set((BVSparse<Memory::JitArenaAllocator> *)this,i);
    }
    bVar5 = NumberTemp::DoTrace(backwardPass);
    if (bVar5) {
      pcVar10 = L"Prepass ";
      if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
        pcVar10 = L"";
      }
      pcVar9 = L"Non ";
      if (bVar4 != false) {
        pcVar9 = L"";
      }
      Output::Print(L"%s: %8s%4sTemp Use (s%-3d): ",L"MarkTempNumber",pcVar10,pcVar9,(ulong)i);
      IR::Instr::DumpSimple(instr);
      Output::Flush();
    }
    bVar4 = OpCodeAttr::TempNumberTransfer(instr->m_opcode);
    if ((bVar4) &&
       (BVSparse<Memory::JitArenaAllocator>::Set
                  (&(this->super_NumberTemp).super_TempTrackerBase.tempTransferredSyms,i),
       (this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies !=
       (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
      pOVar1 = instr->m_dst;
      OVar6 = IR::Opnd::GetKind(pOVar1);
      if (OVar6 == OpndKindReg) {
        OVar6 = IR::Opnd::GetKind(pOVar1);
        if (OVar6 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_0063cfd4;
          *puVar7 = 0;
        }
        dstSymID = *(uint *)(pOVar1[1]._vptr_Opnd + 2);
        if (dstSymID != i) {
          TempTrackerBase::AddTransferDependencies
                    ((TempTrackerBase *)this,i,dstSymID,
                     (this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies);
          bVar4 = NumberTemp::DoTrace(backwardPass);
          if (bVar4) {
            pcVar10 = L"Prepass ";
            if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
              pcVar10 = L"";
            }
            Output::Print(L"%s: %8s s%d -> s%d: ",L"MarkTempNumber",pcVar10,(ulong)dstSymID,(ulong)i
                         );
            ppBVar8 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                                ((this->super_NumberTemp).super_TempTrackerBase.
                                 tempTransferDependencies,i);
            BVSparse<Memory::JitArenaAllocator>::Dump(*ppBVar8);
          }
        }
      }
    }
    if (!bVar3) {
      return;
    }
    BVSparse<Memory::JitArenaAllocator>::Set
              (&(this->super_NumberTemp).super_TempTrackerBase.tempTransferredSyms,i);
    pOVar1 = instr->m_dst;
    OVar6 = IR::Opnd::GetKind(pOVar1);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) goto LAB_0063cfd4;
      *puVar7 = 0;
    }
    propertySym = (PropertySym *)pOVar1[1]._vptr_Opnd;
    if ((propertySym->super_Sym).m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar3) {
LAB_0063cfd4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    NumberTemp::PropagateTempPropertyTransferStoreDependencies
              (&this->super_NumberTemp,i,propertySym,backwardPass);
    bVar3 = NumberTemp::DoTrace(backwardPass);
    if ((bVar3) &&
       ((this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies !=
        (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
      pcVar10 = L"Prepass ";
      if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
        pcVar10 = L"";
      }
      Output::Print(L"%s: %8s (PropId:%d)+[] -> s%d: ",L"MarkTempNumber",pcVar10,
                    (ulong)(uint)propertySym->m_propertyId,(ulong)i);
      ppBVar8 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                          ((this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies,i
                          );
      if (ppBVar8 == (BVSparse<Memory::JitArenaAllocator> **)0x0) {
        Output::Print(L"[]\n");
        return;
      }
      BVSparse<Memory::JitArenaAllocator>::Dump(*ppBVar8);
      return;
    }
  }
  return;
}

Assistant:

void
TempTracker<T>::ProcessUse(StackSym * sym, BackwardPass * backwardPass)
{
    // Don't care about type specialized syms
    if (!sym->IsVar())
    {
        return;
    }
    IR::Instr * instr = backwardPass->currentInstr;
    SymID usedSymID = sym->m_id;
    bool isTempPropertyTransferStore = T::IsTempPropertyTransferStore(instr, backwardPass);
    bool isTempUse = isTempPropertyTransferStore || T::IsTempUse(instr, sym, backwardPass);
    if (!isTempUse)
    {
        this->nonTempSyms.Set(usedSymID);
    }
#if DBG
    if (T::DoTrace(backwardPass))
    {
        Output::Print(_u("%s: %8s%4sTemp Use (s%-3d): "), T::GetTraceName(),
            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), isTempUse ? _u("") : _u("Non "), usedSymID);
        instr->DumpSimple();
        Output::Flush();
    }
#endif
    if (T::IsTempTransfer(instr))
    {
        this->tempTransferredSyms.Set(usedSymID);

        // Track dependencies if we are in loop only
        if (this->tempTransferDependencies != nullptr)
        {
            IR::Opnd * dstOpnd = instr->GetDst();
            if (dstOpnd->IsRegOpnd())
            {
                SymID dstSymID = dstOpnd->AsRegOpnd()->m_sym->m_id;

                if (dstSymID != usedSymID)
                {
                    // Record that the usedSymID may propagate to dstSymID and all the symbols
                    // that it may propagate to as well
                    this->AddTransferDependencies(usedSymID, dstSymID, this->tempTransferDependencies);
#if DBG_DUMP
                    if (T::DoTrace(backwardPass))
                    {
                        Output::Print(_u("%s: %8s s%d -> s%d: "), T::GetTraceName(),
                            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), dstSymID, usedSymID);
                        (*this->tempTransferDependencies->Get(usedSymID))->Dump();
                    }
#endif
                }
            }
        }
    }

    if (isTempPropertyTransferStore)
    {
        this->tempTransferredSyms.Set(usedSymID);
        PropertySym * propertySym = instr->GetDst()->AsSymOpnd()->m_sym->AsPropertySym();
        this->PropagateTempPropertyTransferStoreDependencies(usedSymID, propertySym, backwardPass);

#if DBG_DUMP
        if (T::DoTrace(backwardPass) && this->tempTransferDependencies)
        {
            Output::Print(_u("%s: %8s (PropId:%d)+[] -> s%d: "), T::GetTraceName(),
                backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), propertySym->m_propertyId, usedSymID);
            BVSparse<JitArenaAllocator> ** transferDependencies = this->tempTransferDependencies->Get(usedSymID);
            if (transferDependencies)
            {
                (*transferDependencies)->Dump();
            }
            else
            {
                Output::Print(_u("[]\n"));
            }
        }
#endif
    }
}